

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::Internal_Read3dmLightOrGeometryUpdateManifest
          (ON_BinaryArchive *this,Type component_type,ON_UUID component_id,int component_index,
          ON_wString *component_name)

{
  bool bVar1;
  bool bVar2;
  ON_ComponentManifestItem *this_00;
  ON_ManifestMapItem map_item;
  ON_NameHash component_name_hash;
  ON_ManifestMapItem local_88;
  ON_NameHash local_58;
  
  ON_NameHash::Create(&local_58,&ON_nil_uuid,component_name);
  bVar2 = false;
  this_00 = ON_ComponentManifest::AddComponentToManifest
                      (&this->m_manifest,component_type,0,component_id,&local_58);
  bVar1 = ON_ComponentManifestItem::IsUnset(this_00);
  if (bVar1) goto LAB_0053dc29;
  if (component_type < NumOf) {
    if ((0x3cffeU >> (component_type & 0x1f) & 1) == 0) {
      if ((0x3000U >> (component_type & 0x1f) & 1) == 0) goto LAB_0053db67;
      goto LAB_0053db88;
    }
    if (component_index < 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0xe3b,"","component_index should have value >= 0");
      component_index = ON_ComponentManifestItem::Index(this_00);
    }
  }
  else {
LAB_0053db67:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x7c4,"","Invalid component_type parameter.");
LAB_0053db88:
    if (component_index != -0x7fffffff) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0xe43,"","component_index should have value ON_UNSET_INT_INDEX");
    }
    component_index = -0x7fffffff;
  }
  local_88.m_component_type = Unset;
  local_88.m_reserved = 0;
  local_88.m_source_index = -0x7fffffff;
  local_88.m_destination_index = -0x7fffffff;
  local_88.m_source_id.Data1 = 0;
  local_88.m_source_id.Data2 = 0;
  local_88.m_source_id.Data3 = 0;
  local_88.m_source_id.Data4[0] = '\0';
  local_88.m_source_id.Data4[1] = '\0';
  local_88.m_source_id.Data4[2] = '\0';
  local_88.m_source_id.Data4[3] = '\0';
  local_88.m_source_id.Data4[4] = '\0';
  local_88.m_source_id.Data4[5] = '\0';
  local_88.m_source_id.Data4[6] = '\0';
  local_88.m_source_id.Data4[7] = '\0';
  local_88.m_destination_id.Data1 = 0;
  local_88.m_destination_id.Data2 = 0;
  local_88.m_destination_id.Data3 = 0;
  local_88.m_destination_id.Data4[0] = '\0';
  local_88.m_destination_id.Data4[1] = '\0';
  local_88.m_destination_id.Data4[2] = '\0';
  local_88.m_destination_id.Data4[3] = '\0';
  local_88.m_destination_id.Data4[4] = '\0';
  local_88.m_destination_id.Data4[5] = '\0';
  local_88.m_destination_id.Data4[6] = '\0';
  local_88.m_destination_id.Data4[7] = '\0';
  bVar1 = ON_ManifestMapItem::SetDestinationIdentification
                    (&local_88,component_type,component_id,component_index);
  if (bVar1) {
    bVar1 = ON_ManifestMapItem::SetSourceIdentification(&local_88,this_00);
    if (bVar1) {
      bVar2 = ON_ManifestMap::AddMapItem(&this->m_manifest_map,&local_88);
      goto LAB_0053dc29;
    }
  }
  bVar2 = false;
LAB_0053dc29:
  if (bVar2 == false) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0xe54,"","Unable to update archive manifest and map.");
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::Internal_Read3dmLightOrGeometryUpdateManifest(
  ON_ModelComponent::Type component_type,
  ON_UUID component_id,
  int component_index,
  const ON_wString& component_name
  )
{
  bool rc = false;
  for (;;)
  {
    const ON__UINT64 no_serial_number_yet = 0;
    const ON_NameHash component_name_hash = ON_NameHash::Create(ON_nil_uuid, component_name);
    const ON_ComponentManifestItem& manifest_item = m_manifest.AddComponentToManifest(component_type, no_serial_number_yet, component_id, component_name_hash);
    if (manifest_item.IsUnset())
      break;

    if (ON_ModelComponent::IndexRequired(component_type))
    {
      if (component_index < 0)
      {
        ON_ERROR("component_index should have value >= 0");
        component_index = manifest_item.Index();
      }
    }
    else
    {
      if (ON_UNSET_INT_INDEX != component_index)
      {
        ON_ERROR("component_index should have value ON_UNSET_INT_INDEX");
        component_index = ON_UNSET_INT_INDEX;
      }
    }

    ON_ManifestMapItem map_item;
    // Rhino will update destination if it changes id or index
    if (!map_item.SetDestinationIdentification(component_type, component_id, component_index))
      break;
    if (!map_item.SetSourceIdentification(&manifest_item))
      break;

    rc = m_manifest_map.AddMapItem(map_item);
    break;
  }
  if (!rc)
  {
    ON_ERROR("Unable to update archive manifest and map.");
  }
  return rc;

}